

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkRestrashZero(Abc_Ntk_t *pNtk,int fCleanup)

{
  ulong *puVar1;
  uint *puVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  Abc_Ntk_t *pNtkNew;
  long lVar7;
  Abc_Obj_t *pAVar8;
  char *pName;
  Vec_Ptr_t *pVVar9;
  Abc_Ntk_t *pAVar10;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    iVar5 = Abc_NtkGetChoiceNum(pNtk);
    if (iVar5 != 0) {
      puts("Warning: The choice nodes in the original AIG are removed by strashing.");
    }
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    pVVar9 = pNtk->vBoxes;
    if (0 < pVVar9->nSize) {
      lVar7 = 0;
      iVar5 = 0;
      do {
        plVar3 = (long *)pVVar9->pArray[lVar7];
        if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
          if (plVar3[7] == 2) {
            puVar1 = (ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                        (long)*(int *)plVar3[6] * 8) + 0x40);
            *puVar1 = *puVar1 ^ 1;
            pVVar9 = pNtk->vBoxes;
          }
          else if (plVar3[7] == 3) {
            iVar5 = iVar5 + 1;
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar9->nSize);
      if (iVar5 != 0) {
        printf("Converting %d flops from don\'t-care to zero initial value.\n");
      }
    }
    pVVar9 = pNtk->vObjs;
    if (0 < pVVar9->nSize) {
      lVar7 = 0;
      do {
        plVar3 = (long *)pVVar9->pArray[lVar7];
        if ((plVar3 != (long *)0x0) && (uVar6 = *(uint *)((long)plVar3 + 0x14), (uVar6 & 0xf) == 7))
        {
          lVar4 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
          pAVar8 = Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,
                              (Abc_Obj_t *)
                              ((ulong)(uVar6 >> 10 & 1) ^
                              *(ulong *)(*(long *)(lVar4 + (long)*(int *)plVar3[4] * 8) + 0x40)),
                              (Abc_Obj_t *)
                              ((ulong)(uVar6 >> 0xb & 1) ^
                              *(ulong *)(*(long *)(lVar4 + (long)((int *)plVar3[4])[1] * 8) + 0x40))
                             );
          plVar3[8] = (long)pAVar8;
          pVVar9 = pNtk->vObjs;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar9->nSize);
    }
    Abc_NtkFinalize(pNtk,pNtkNew);
    pVVar9 = pNtkNew->vBoxes;
    if (0 < pVVar9->nSize) {
      lVar7 = 0;
      do {
        plVar3 = (long *)pVVar9->pArray[lVar7];
        if (((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) && (plVar3[7] == 2)) {
          puVar2 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                     (long)*(int *)plVar3[4] * 8) + 0x14);
          *puVar2 = *puVar2 ^ 0x400;
          pAVar8 = Abc_NodeFindCoFanout
                             (*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)plVar3[6] * 8));
          if (pAVar8 != (Abc_Obj_t *)0x0) {
            Nm_ManDeleteIdName(*(Nm_Man_t **)(*plVar3 + 0x18),
                               *(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                                 (long)*(int *)plVar3[6] * 8) + 0x10));
            pAVar8 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
            pName = Abc_ObjName(pAVar8);
            Abc_ObjAssignName(pAVar8,pName,"_inv");
          }
        }
        lVar7 = lVar7 + 1;
        pVVar9 = pNtkNew->vBoxes;
      } while (lVar7 < pVVar9->nSize);
      if (0 < pVVar9->nSize) {
        lVar7 = 0;
        do {
          if ((*(uint *)((long)pVVar9->pArray[lVar7] + 0x14) & 0xf) == 8) {
            *(undefined8 *)((long)pVVar9->pArray[lVar7] + 0x38) = 1;
            pVVar9 = pNtkNew->vBoxes;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < pVVar9->nSize);
      }
    }
    if (fCleanup != 0) {
      uVar6 = Abc_AigCleanup((Abc_Aig_t *)pNtkNew->pManFunc);
      if (uVar6 != 0) {
        printf("Abc_NtkRestrash(): AIG cleanup removed %d nodes (this is a bug).\n",(ulong)uVar6);
      }
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar10 = Abc_NtkDup(pNtk->pExdc);
      pNtkNew->pExdc = pAVar10;
    }
    if (pNtk->vNameIds != (Vec_Int_t *)0x0) {
      Abc_NtkTransferNameIds(pNtk,pNtkNew);
      if (pNtk->vNameIds != (Vec_Int_t *)0x0) {
        Abc_NtkUpdateNameIds(pNtkNew);
      }
    }
    iVar5 = Abc_NtkCheck(pNtkNew);
    if (iVar5 == 0) {
      puts("Abc_NtkStrash: The network check has failed.");
      Abc_NtkDelete(pNtkNew);
      pNtkNew = (Abc_Ntk_t *)0x0;
    }
    return pNtkNew;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                ,0xbc,"Abc_Ntk_t *Abc_NtkRestrashZero(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkRestrashZero( Abc_Ntk_t * pNtk, int fCleanup )
{
//    extern int timeRetime;
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj;
    int i, nNodes;//, RetValue;
    int Counter = 0;
    assert( Abc_NtkIsStrash(pNtk) );
//timeRetime = Abc_Clock();
    // print warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Warning: The choice nodes in the original AIG are removed by strashing.\n" );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // complement the 1-values registers
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        if ( Abc_LatchIsInitDc(pObj) )
            Counter++;
        else if ( Abc_LatchIsInit1(pObj) )
            Abc_ObjFanout0(pObj)->pCopy = Abc_ObjNot(Abc_ObjFanout0(pObj)->pCopy);
    }
    if ( Counter )
    printf( "Converting %d flops from don't-care to zero initial value.\n", Counter );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // finalize the network
    Abc_NtkFinalize( pNtk, pNtkAig );
    // complement the 1-valued registers
    Abc_NtkForEachLatch( pNtkAig, pObj, i )
        if ( Abc_LatchIsInit1(pObj) )
        {
            Abc_ObjXorFaninC( Abc_ObjFanin0(pObj), 0 );
            // if latch has PO as one of its fanouts change latch name
            if ( Abc_NodeFindCoFanout( Abc_ObjFanout0(pObj) ) )
            {
                Nm_ManDeleteIdName( pObj->pNtk->pManName, Abc_ObjFanout0(pObj)->Id );
                Abc_ObjAssignName( Abc_ObjFanout0(pObj), Abc_ObjName(Abc_ObjFanout0(pObj)), "_inv" );
            }
        }
    // set all constant-0 values
    Abc_NtkForEachLatch( pNtkAig, pObj, i )
        Abc_LatchSetInit0( pObj );

    // print warning about self-feed latches
//    if ( Abc_NtkCountSelfFeedLatches(pNtkAig) )
//        printf( "Warning: The network has %d self-feeding latches.\n", Abc_NtkCountSelfFeedLatches(pNtkAig) );
    // perform cleanup if requested
    if ( fCleanup && (nNodes = Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc)) ) 
        printf( "Abc_NtkRestrash(): AIG cleanup removed %d nodes (this is a bug).\n", nNodes );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // transfer name IDs
    if ( pNtk->vNameIds )
        Abc_NtkTransferNameIds( pNtk, pNtkAig );
    if ( pNtk->vNameIds )
        Abc_NtkUpdateNameIds( pNtkAig );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
//timeRetime = Abc_Clock() - timeRetime;
//    if ( RetValue = Abc_NtkRemoveSelfFeedLatches(pNtkAig) )
//        printf( "Modified %d self-feeding latches. The result may not verify.\n", RetValue );
    return pNtkAig;

}